

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O1

int SendBreakPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,int mode,int breakduration)

{
  int iVar1;
  ssize_t sVar2;
  char *__s;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  timespec req;
  timespec local_40;
  
  iVar1 = (pPathfinderDVL->RS232Port).DevType;
  switch(mode) {
  case 1:
    if (iVar1 == 0) {
      iVar1 = tcsendbreak(*(int *)&(pPathfinderDVL->RS232Port).hDev,breakduration);
      if (iVar1 != 0) goto LAB_001b0c50;
      local_40.tv_sec = (long)breakduration / 1000;
      local_40.tv_nsec = ((long)breakduration % 1000) * 1000000;
      nanosleep(&local_40,(timespec *)0x0);
    }
    iVar1 = (pPathfinderDVL->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pPathfinderDVL->RS232Port).s;
      uVar3 = 0;
      do {
        sVar2 = send(iVar1,"===\r" + uVar3,(long)(4 - (int)uVar3),0);
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while ((int)uVar5 < 4);
    }
    else {
      if (iVar1 != 0) goto LAB_001b0c50;
      iVar1 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
      uVar3 = 0;
      do {
        sVar2 = write(iVar1,"===\r" + uVar3,(ulong)(4 - (int)uVar3));
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while (uVar5 < 4);
    }
    break;
  case 2:
    if (iVar1 != 0) goto LAB_001b06eb;
    iVar1 = tcsendbreak(*(int *)&(pPathfinderDVL->RS232Port).hDev,breakduration);
    if (iVar1 != 0) goto LAB_001b0c50;
    goto LAB_001b0a4d;
  case 3:
    if (iVar1 - 1U < 4) {
      iVar1 = (pPathfinderDVL->RS232Port).s;
      uVar3 = 0;
      do {
        sVar2 = send(iVar1,"===\r" + uVar3,(long)(4 - (int)uVar3),0);
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while ((int)uVar5 < 4);
    }
    else {
      if (iVar1 != 0) goto LAB_001b0c50;
      iVar1 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
      uVar3 = 0;
      do {
        sVar2 = write(iVar1,"===\r" + uVar3,(ulong)(4 - (int)uVar3));
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while (uVar5 < 4);
    }
    break;
  case 4:
    if (iVar1 == 0) {
      iVar1 = tcsendbreak(*(int *)&(pPathfinderDVL->RS232Port).hDev,breakduration);
      if ((iVar1 == 0) &&
         (iVar1 = tcsendbreak(*(int *)&(pPathfinderDVL->RS232Port).hDev,breakduration), iVar1 == 0))
      {
        local_40.tv_sec = (long)(breakduration / 2) / 1000;
        local_40.tv_nsec = ((long)(breakduration / 2) % 1000) * 1000000;
        nanosleep(&local_40,(timespec *)0x0);
        iVar1 = tcsendbreak(*(int *)&(pPathfinderDVL->RS232Port).hDev,breakduration);
        if (iVar1 == 0) {
          lVar4 = (long)(int)((double)breakduration * 3.5) / 1000;
          lVar6 = ((long)(int)((double)breakduration * 3.5) % 1000) * 1000000;
          goto LAB_001b0c47;
        }
      }
      goto LAB_001b0c50;
    }
LAB_001b06eb:
    __s = "Cannot send a Hard Break to a PathfinderDVL through Ethernet. ";
LAB_001b0c57:
    puts(__s);
    return 1;
  case 5:
    if (iVar1 - 1U < 4) {
      iVar1 = (pPathfinderDVL->RS232Port).s;
      uVar3 = 0;
      do {
        sVar2 = send(iVar1,"===\r" + uVar3,(long)(4 - (int)uVar3),0);
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while ((int)uVar5 < 4);
    }
    else {
      if (iVar1 != 0) goto LAB_001b0c50;
      iVar1 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
      uVar3 = 0;
      do {
        sVar2 = write(iVar1,"===\r" + uVar3,(ulong)(4 - (int)uVar3));
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while (uVar5 < 4);
    }
    if ((pPathfinderDVL->bSaveRawData != 0) && ((FILE *)pPathfinderDVL->pfSaveFile != (FILE *)0x0))
    {
      fwrite("===\r",4,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    lVar4 = (long)breakduration / 1000;
    lVar6 = ((long)breakduration % 1000) * 1000000;
    uVar3 = 0;
    local_40.tv_sec = lVar4;
    local_40.tv_nsec = lVar6;
    nanosleep(&local_40,(timespec *)0x0);
    iVar1 = (pPathfinderDVL->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pPathfinderDVL->RS232Port).s;
      do {
        sVar2 = send(iVar1,"===\r" + uVar3,(long)(4 - (int)uVar3),0);
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while ((int)uVar5 < 4);
    }
    else {
      if (iVar1 != 0) goto LAB_001b0c50;
      iVar1 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
      uVar3 = 0;
      do {
        sVar2 = write(iVar1,"===\r" + uVar3,(ulong)(4 - (int)uVar3));
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while (uVar5 < 4);
    }
    goto LAB_001b0c01;
  default:
    if (iVar1 == 0) {
      iVar1 = tcsendbreak(*(int *)&(pPathfinderDVL->RS232Port).hDev,breakduration);
      if ((iVar1 == 0) &&
         (iVar1 = tcsendbreak(*(int *)&(pPathfinderDVL->RS232Port).hDev,breakduration), iVar1 == 0))
      {
        local_40.tv_sec = (long)(breakduration / 2) / 1000;
        local_40.tv_nsec = ((long)(breakduration / 2) % 1000) * 1000000;
        nanosleep(&local_40,(timespec *)0x0);
        iVar1 = tcsendbreak(*(int *)&(pPathfinderDVL->RS232Port).hDev,breakduration);
        if (iVar1 == 0) {
          local_40.tv_sec = (long)(int)((double)breakduration * 3.5) / 1000;
          local_40.tv_nsec = ((long)(int)((double)breakduration * 3.5) % 1000) * 1000000;
          nanosleep(&local_40,(timespec *)0x0);
          goto LAB_001b06ff;
        }
      }
LAB_001b0c50:
      __s = "Error writing data to a PathfinderDVL. ";
      goto LAB_001b0c57;
    }
LAB_001b06ff:
    iVar1 = (pPathfinderDVL->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pPathfinderDVL->RS232Port).s;
      uVar3 = 0;
      do {
        sVar2 = send(iVar1,"===\r" + uVar3,(long)(4 - (int)uVar3),0);
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while ((int)uVar5 < 4);
    }
    else {
      if (iVar1 != 0) goto LAB_001b0c50;
      iVar1 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
      uVar3 = 0;
      do {
        sVar2 = write(iVar1,"===\r" + uVar3,(ulong)(4 - (int)uVar3));
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while (uVar5 < 4);
    }
    if ((pPathfinderDVL->bSaveRawData != 0) && ((FILE *)pPathfinderDVL->pfSaveFile != (FILE *)0x0))
    {
      fwrite("===\r",4,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    lVar4 = (long)breakduration / 1000;
    lVar6 = ((long)breakduration % 1000) * 1000000;
    uVar3 = 0;
    local_40.tv_sec = lVar4;
    local_40.tv_nsec = lVar6;
    nanosleep(&local_40,(timespec *)0x0);
    iVar1 = (pPathfinderDVL->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pPathfinderDVL->RS232Port).s;
      do {
        sVar2 = send(iVar1,"===\r" + uVar3,(long)(4 - (int)uVar3),0);
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while ((int)uVar5 < 4);
    }
    else {
      if (iVar1 != 0) goto LAB_001b0c50;
      iVar1 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
      uVar3 = 0;
      do {
        sVar2 = write(iVar1,"===\r" + uVar3,(ulong)(4 - (int)uVar3));
        if ((int)sVar2 < 1) goto LAB_001b0c50;
        uVar5 = (int)uVar3 + (int)sVar2;
        uVar3 = (ulong)uVar5;
      } while (uVar5 < 4);
    }
LAB_001b0c01:
    if ((pPathfinderDVL->bSaveRawData != 0) && ((FILE *)pPathfinderDVL->pfSaveFile != (FILE *)0x0))
    {
      fwrite("===\r",4,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    goto LAB_001b0c47;
  }
  if ((pPathfinderDVL->bSaveRawData != 0) && ((FILE *)pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
    fwrite("===\r",4,1,(FILE *)pPathfinderDVL->pfSaveFile);
    fflush((FILE *)pPathfinderDVL->pfSaveFile);
  }
LAB_001b0a4d:
  lVar4 = (long)breakduration / 1000;
  lVar6 = ((long)breakduration % 1000) * 1000000;
LAB_001b0c47:
  local_40.tv_nsec = lVar6;
  local_40.tv_sec = lVar4;
  nanosleep(&local_40,(timespec *)0x0);
  return 0;
}

Assistant:

inline int SendBreakPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, int mode, int breakduration)
{
	char* softbreakbuf = "===\r";

	switch(mode)
	{
	case HARD_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration);
		}
		else
		{
			printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
			return EXIT_FAILURE;
		}
		break;
	case SOFT_BREAK_MODE_PATHFINDERDVL:
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case HARD_SOFT_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration);
		}
		else
		{
			//printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
		}
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case DOUBLE_HARD_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration/2);
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep((int)(3.5*breakduration));
		}
		else
		{
			printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
			return EXIT_FAILURE;
		}
		break;
	case DOUBLE_SOFT_BREAK_MODE_PATHFINDERDVL:
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case DOUBLE_HARD_SOFT_BREAK_MODE_PATHFINDERDVL:
	default:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration/2);
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep((int)(3.5*breakduration));
		}
		else
		{
			//printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
		}
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	}

	return EXIT_SUCCESS;
}